

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall
GEO::AdaptiveKdTree::plane_split
          (AdaptiveKdTree *this,index_t b_in,index_t e_in,coord_index_t coord,double val,
          index_t *br1_out,index_t *br2_out)

{
  double *pdVar1;
  pointer puVar2;
  double *pdVar3;
  bool bVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  uint uVar6;
  ulong uVar7;
  index_t iVar8;
  uint uVar9;
  
  uVar5 = e_in - 1;
  puVar2 = (this->super_KdTree).point_index_.
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar9 = (int)CONCAT71(in_register_00000009,coord) << 3;
  pdVar3 = (this->super_KdTree).super_NearestNeighborSearch.points_;
  uVar6 = uVar5;
  do {
    uVar7 = (ulong)uVar6;
    if ((int)b_in < (int)e_in) {
      iVar8 = b_in;
      do {
        b_in = iVar8;
        pdVar1 = (double *)
                 ((long)pdVar3 +
                 (ulong)(puVar2[b_in] * (this->super_KdTree).super_NearestNeighborSearch.stride_) *
                 8 + (ulong)uVar9);
        if (val < *pdVar1 || val == *pdVar1) break;
        iVar8 = b_in + 1;
        b_in = e_in;
      } while (e_in != iVar8);
    }
    if (-1 < (int)uVar6) {
      do {
        if (*(double *)
             ((long)pdVar3 +
             (ulong)(puVar2[uVar7] * (this->super_KdTree).super_NearestNeighborSearch.stride_) * 8 +
             (ulong)uVar9) < val) goto LAB_0015f78e;
        bVar4 = 0 < (long)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar4);
      uVar7 = 0xffffffff;
    }
LAB_0015f78e:
    if ((int)uVar7 < (int)b_in) {
      puVar2 = (this->super_KdTree).point_index_.
               super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar3 = (this->super_KdTree).super_NearestNeighborSearch.points_;
      uVar6 = b_in;
      do {
        uVar9 = uVar6;
        if ((int)uVar6 < (int)e_in) {
          do {
            uVar9 = uVar6;
            if (val < pdVar3[(ulong)coord +
                             (ulong)(puVar2[uVar6] *
                                    (this->super_KdTree).super_NearestNeighborSearch.stride_)])
            break;
            uVar6 = uVar6 + 1;
            uVar9 = e_in;
          } while (e_in != uVar6);
        }
        if ((int)b_in <= (int)uVar5) {
          uVar6 = uVar5;
          do {
            uVar5 = uVar6;
            if (pdVar3[(ulong)coord +
                       (ulong)(puVar2[uVar6] *
                              (this->super_KdTree).super_NearestNeighborSearch.stride_)] <= val)
            break;
            bVar4 = (int)b_in < (int)uVar6;
            uVar5 = b_in - 1;
            uVar6 = uVar6 - 1;
          } while (bVar4);
        }
        if ((int)uVar5 < (int)uVar9) {
          *br1_out = b_in;
          *br2_out = uVar9;
          return;
        }
        uVar6 = puVar2[uVar9];
        puVar2[uVar9] = puVar2[uVar5];
        puVar2[uVar5] = uVar6;
        uVar6 = uVar9 + 1;
        uVar5 = uVar5 - 1;
      } while( true );
    }
    uVar6 = puVar2[b_in];
    puVar2[b_in] = puVar2[uVar7 & 0xffffffff];
    puVar2[uVar7 & 0xffffffff] = uVar6;
    b_in = b_in + 1;
    uVar6 = (int)uVar7 - 1;
  } while( true );
}

Assistant:

void AdaptiveKdTree::plane_split(
	index_t b_in, index_t e_in, coord_index_t coord, double val,
	index_t& br1_out, index_t& br2_out
    ) {
	int b = int(b_in);
	int e = int(e_in);
	int l=b;
	int r=e-1;
	while(true) {
	    while(l < e && point_coord(l,coord) < val) {
		++l;
	    }
	    while(r >= 0 && point_coord(r,coord) >= val) {
		--r;
	    }
	    if(l > r) {
		break;
	    }
	    std::swap(point_index_[l], point_index_[r]);
	    ++l; --r;
	}
	int br1 = l;
	r = e-1;
	while(true) {
	    while(l < e && point_coord(l,coord) <= val) {
		++l;
	    }
	    while(r >= br1 && point_coord(r,coord) > val) {
		--r;
	    }
	    if(l > r) {
		break;
	    }
	    std::swap(point_index_[l], point_index_[r]);
	    ++l; --r;
	}
	int br2 = l;
	br1_out = index_t(br1);
	br2_out = index_t(br2);
    }